

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O0

istream * FIX::operator>>(istream *stream,Settings *s)

{
  bool bVar1;
  long *plVar2;
  reference this;
  string local_598;
  undefined4 local_574;
  __normal_iterator<FIX::Dictionary_*,_std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>_>
  local_570;
  undefined1 local_568 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keyValue;
  Dictionary local_508;
  __normal_iterator<FIX::Dictionary_*,_std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>_>
  local_4b0;
  const_iterator local_4a8;
  Dictionary *local_4a0;
  allocator<char> local_491;
  string local_490;
  string local_470;
  __normal_iterator<FIX::Dictionary_*,_std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>_>
  local_440;
  iterator section;
  string line;
  char buffer [1024];
  Settings *s_local;
  istream *stream_local;
  
  std::__cxx11::string::string((string *)&section);
  local_440._M_current =
       (Dictionary *)
       std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::end(&s->m_sections);
  while( true ) {
    plVar2 = (long *)std::istream::getline((char *)stream,(long)((long)&line.field_2 + 8));
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,line.field_2._M_local_buf + 8,&local_491);
    string_strip(&local_470,&local_490);
    std::__cxx11::string::operator=((string *)&section,(string *)&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    bVar1 = isComment((string *)&section);
    if (!bVar1) {
      bVar1 = isSection((string *)&section);
      if (bVar1) {
        local_4b0._M_current =
             (Dictionary *)
             std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::end(&s->m_sections);
        __gnu_cxx::
        __normal_iterator<FIX::Dictionary_const*,std::vector<FIX::Dictionary,std::allocator<FIX::Dictionary>>>
        ::__normal_iterator<FIX::Dictionary*>
                  ((__normal_iterator<FIX::Dictionary_const*,std::vector<FIX::Dictionary,std::allocator<FIX::Dictionary>>>
                    *)&local_4a8,&local_4b0);
        splitSection((string *)((long)&keyValue.second.field_2 + 8),(string *)&section);
        Dictionary::Dictionary(&local_508,(string *)((long)&keyValue.second.field_2 + 8));
        local_4a0 = (Dictionary *)
                    std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::insert
                              (&s->m_sections,local_4a8,&local_508);
        local_440._M_current = local_4a0;
        Dictionary::~Dictionary(&local_508);
        std::__cxx11::string::~string((string *)(keyValue.second.field_2._M_local_buf + 8));
      }
      else {
        bVar1 = isKeyValue((string *)&section);
        if (bVar1) {
          splitKeyValue((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_568,(string *)&section);
          local_570._M_current =
               (Dictionary *)
               std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::end(&s->m_sections);
          bVar1 = __gnu_cxx::operator==(&local_440,&local_570);
          if (bVar1) {
            local_574 = 2;
          }
          else {
            this = __gnu_cxx::
                   __normal_iterator<FIX::Dictionary_*,_std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>_>
                   ::operator*(&local_440);
            if ((s->m_resolveEnvVars & 1U) == 0) {
              std::__cxx11::string::string
                        ((string *)&local_598,(string *)(keyValue.first.field_2._M_local_buf + 8));
            }
            else {
              resolveEnvVars(&local_598,(string *)((long)&keyValue.first.field_2 + 8));
            }
            Dictionary::setString(this,(string *)local_568,&local_598);
            std::__cxx11::string::~string((string *)&local_598);
            local_574 = 0;
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_568);
        }
      }
    }
  }
  local_574 = 1;
  std::__cxx11::string::~string((string *)&section);
  return stream;
}

Assistant:

std::istream &operator>>(std::istream &stream, Settings &s) {
  char buffer[1024];
  std::string line;
  Settings::Sections::iterator section = s.m_sections.end();
  ;

  while (stream.getline(buffer, sizeof(buffer))) {
    line = string_strip(buffer);
    if (isComment(line)) {
      continue;
    } else if (isSection(line)) {
      section = s.m_sections.insert(s.m_sections.end(), Dictionary(splitSection(line)));
    } else if (isKeyValue(line)) {
      std::pair<std::string, std::string> keyValue = splitKeyValue(line);
      if (section == s.m_sections.end()) {
        continue;
      }
      (*section).setString(keyValue.first, s.m_resolveEnvVars ? resolveEnvVars(keyValue.second) : keyValue.second);
    }
  }
  return stream;
}